

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O2

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,string *name,char *regex,char *parentName)

{
  _Rb_tree_header *p_Var1;
  size_t __p;
  cmAlphaNum local_b0;
  string local_80;
  cmAlphaNum local_60;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  (this->FullName)._M_dataplus._M_p = (pointer)&(this->FullName).field_2;
  (this->FullName)._M_string_length = 0;
  (this->FullName).field_2._M_local_buf[0] = '\0';
  (this->GroupRegex).regmust = (char *)0x0;
  (this->GroupRegex).program = (char *)0x0;
  (this->GroupRegex).progsize = 0;
  memset(&this->GroupRegex,0,0xaa);
  p_Var1 = &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Internal)._M_t.
  super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>._M_t.
  super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>.
  super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl =
       (cmSourceGroupInternals *)0x0;
  std::make_unique<cmSourceGroupInternals>();
  __p = local_b0.View_._M_len;
  local_b0.View_._M_len = 0;
  std::__uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::reset
            ((__uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
              *)&this->Internal,(pointer)__p);
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::~unique_ptr
            ((unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_> *)
             &local_b0);
  SetGroupRegex(this,regex);
  if (parentName != (char *)0x0) {
    local_b0.View_._M_len = strlen(parentName);
    local_60.View_._M_str = local_60.Digits_;
    local_60.View_._M_len = 1;
    local_60.Digits_[0] = '\\';
    local_b0.View_._M_str = parentName;
    cmStrCat<>(&local_80,&local_b0,&local_60);
    std::__cxx11::string::operator=((string *)&this->FullName,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::append((string *)&this->FullName);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(std::string name, const char* regex,
                             const char* parentName)
  : Name(std::move(name))
{
  this->Internal = cm::make_unique<cmSourceGroupInternals>();
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = cmStrCat(parentName, '\\');
  }
  this->FullName += this->Name;
}